

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::DrawAndCheck<int>
          (AttributeFormatTest *this,GLint size,bool normalized)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  long lVar4;
  long *plVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  void *__src;
  size_t sVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  uint uVar17;
  string result_str;
  string reference_str;
  int array_data [16];
  int reference [8];
  int result [8];
  stringstream ss;
  long *local_2a8 [2];
  long local_298 [2];
  long *local_288 [2];
  long local_278 [2];
  int local_268 [4];
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  long *local_220;
  long local_210 [2];
  AttributeFormatTest *local_200;
  int local_1f8 [8];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  undefined1 local_1a8 [104];
  ios_base local_140 [8];
  ios_base local_138 [264];
  long lVar8;
  
  iVar6 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar6);
  (**(code **)(lVar8 + 0x1680))(this->m_po);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUseProgram call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91b);
  local_200 = this;
  (**(code **)(lVar8 + 0xd8))(this->m_vao);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x91e);
  (**(code **)(lVar8 + 0x30))(0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glBeginTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x922);
  (**(code **)(lVar8 + 0x538))(0,0,2);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glDrawArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x925);
  (**(code **)(lVar8 + 0x638))();
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glEndTransformFeedback call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x928);
  __src = (void *)(**(code **)(lVar8 + 0xcf8))(0x8c8e,35000);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glMapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x92c);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  uVar3 = size * 2;
  if (0 < (int)uVar3) {
    memcpy(&local_1d8,__src,(ulong)uVar3 * 4);
  }
  (**(code **)(lVar8 + 0x1670))(0x8c8e);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"glUnmapBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x936);
  if (normalized) {
    uVar17 = 0x3fb00000;
  }
  else {
    uVar17 = 0x3ff00000;
  }
  local_268[0] = 0;
  local_268[1] = (int)(double)((ulong)uVar17 << 0x20);
  local_268[2] = (int)((double)((ulong)uVar17 << 0x20) + (double)((ulong)uVar17 << 0x20));
  local_268[3] = (int)((double)((ulong)uVar17 << 0x20) * 3.0);
  local_258 = (int)((double)((ulong)uVar17 << 0x20) * 4.0);
  local_254 = (int)((double)((ulong)uVar17 << 0x20) * 5.0);
  local_250 = (int)((double)((ulong)uVar17 << 0x20) * 6.0);
  local_24c = (int)((double)((ulong)uVar17 << 0x20) * 7.0);
  local_248 = (int)((double)((ulong)uVar17 << 0x20) * 8.0);
  local_244 = (int)((double)((ulong)uVar17 << 0x20) * 9.0);
  local_240 = (int)((double)((ulong)uVar17 << 0x20) * 10.0);
  local_23c = (int)((double)((ulong)uVar17 << 0x20) * 11.0);
  local_238 = (int)((double)((ulong)uVar17 << 0x20) * 12.0);
  local_234 = (int)((double)((ulong)uVar17 << 0x20) * 13.0);
  local_230 = (int)((double)((ulong)uVar17 << 0x20) * 14.0);
  local_22c = (int)((double)((ulong)uVar17 << 0x20) * 15.0);
  local_1f8[4] = 0;
  local_1f8[5] = 0;
  local_1f8[6] = 0;
  local_1f8[7] = 0;
  local_1f8[0] = 0;
  local_1f8[1] = 0;
  local_1f8[2] = 0;
  local_1f8[3] = 0;
  iVar10 = 0;
  iVar11 = 0;
  iVar6 = 0;
  do {
    uVar12 = (ulong)(uint)size;
    iVar14 = iVar10;
    iVar13 = iVar11;
    if (0 < size) {
      do {
        local_1f8[iVar13] = local_268[size + iVar14] + local_268[iVar14];
        iVar13 = iVar13 + 1;
        iVar14 = iVar14 + 1;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
    iVar11 = iVar11 + size;
    iVar10 = iVar10 + uVar3;
    bVar16 = iVar6 == 0;
    iVar6 = iVar6 + 1;
  } while (bVar16);
  bVar16 = (int)uVar3 < 1;
  if (0 < (int)uVar3) {
    if (local_1f8[0] == (int)local_1d8) {
      lVar8 = 0;
      do {
        if (uVar3 - 1 == (int)lVar8) {
          return true;
        }
        lVar4 = lVar8 + 1;
        lVar1 = lVar8 + 1;
        lVar2 = lVar8 * 4;
        lVar8 = lVar1;
      } while (local_1f8[lVar4] == *(int *)((long)&local_1d8 + lVar2 + 4));
      bVar16 = (int)uVar3 <= (int)lVar1;
    }
    local_288[0] = local_278;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_288,"[ ","");
    uVar12 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::operator<<(local_1a8,local_1f8[uVar12]);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_288,(ulong)local_2a8[0]);
      if (local_2a8[0] != local_298) {
        operator_delete(local_2a8[0],local_298[0] + 1);
      }
      std::__cxx11::string::append((char *)local_288);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar12 = uVar12 + 1;
    } while (uVar3 != uVar12);
    local_2a8[0] = local_298;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"[ ","");
    uVar12 = 1;
    if (1 < (int)uVar3) {
      uVar12 = (ulong)uVar3;
    }
    uVar15 = 0;
    do {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      std::ostream::operator<<(local_1a8,*(int *)((long)&local_1d8 + uVar15 * 4));
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_append((char *)local_2a8,(ulong)local_220);
      if (local_220 != local_210) {
        operator_delete(local_220,local_210[0] + 1);
      }
      std::__cxx11::string::append((char *)local_2a8);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar15 = uVar15 + 1;
    } while (uVar12 != uVar15);
    local_1b8 = (undefined1  [8])((local_200->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Result vector is equal to ",0x1a);
    plVar5 = local_2a8[0];
    iVar6 = (int)(ostringstream *)&local_1b0;
    if (local_2a8[0] == (long *)0x0) {
      std::ios::clear(iVar6 + (int)local_1b0[-3]);
    }
    else {
      sVar9 = strlen((char *)local_2a8[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar5,sVar9)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,", but ",6);
    plVar5 = local_288[0];
    if (local_288[0] == (long *)0x0) {
      std::ios::clear(iVar6 + (int)local_1b0[-3]);
    }
    else {
      sVar9 = strlen((char *)local_288[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0,(char *)plVar5,sVar9)
      ;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b0," was expected.",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
    std::ios_base::~ios_base(local_140);
    if (local_2a8[0] != local_298) {
      operator_delete(local_2a8[0],local_298[0] + 1);
    }
    if (local_288[0] != local_278) {
      operator_delete(local_288[0],local_278[0] + 1);
    }
  }
  return bVar16;
}

Assistant:

bool AttributeFormatTest::DrawAndCheck(glw::GLint size, bool normalized)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup state. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Draw. */
	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback call failed.");

	gl.drawArrays(GL_POINTS, 0, 2);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call failed.");

	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback call failed.");

	/* Result query. */
	T* result_ptr = (T*)gl.mapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, GL_READ_ONLY);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBuffer call failed.");

	T result[8] = { 0 };

	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		result[i] = result_ptr[i];
	}

	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer call failed.");

	const glw::GLdouble scale = normalized ? (1.0 / 16.0) /* Floating point scalling factor. */ : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	T reference[8] = { 0 };

	for (glw::GLint i = 0; i < 2 /* two points */; ++i)
	{
		for (glw::GLint j = 0; j < size /* size components */; ++j)
		{
			reference[i * size + j] = array_data[i * size * 2 + j] + array_data[i * size * 2 + j + size];
		}
	}

	/* Check result and return. */
	for (glw::GLint i = 0; i < size * 2 /* two points */; ++i)
	{
		if (!AttributeFormatTest::compare<T>(reference[i], result[i]))
		{
			std::string reference_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << reference[j];

				reference_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					reference_str.append(", ");
				}
				else
				{
					reference_str.append(" ]");
				}
			}

			std::string result_str = "[ ";

			for (glw::GLint j = 0; j < size * 2 /* two points */; ++j)
			{
				std::stringstream ss;

				ss << result[j];

				result_str.append(ss.str());

				if (j < size * 2 - 1 /* if it is not the last value */)
				{
					result_str.append(", ");
				}
				else
				{
					result_str.append(" ]");
				}
			}

			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Result vector is equal to "
												<< result_str.c_str() << ", but " << reference_str.c_str()
												<< " was expected." << tcu::TestLog::EndMessage;

			return false;
		}
	}

	return true;
}